

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O0

bool __thiscall TripleBuffer<stStateUI>::update(TripleBuffer<stStateUI> *this,bool force)

{
  byte in_SIL;
  stParameters *in_RDI;
  lock_guard<std::mutex> lock;
  stParameters *in_stack_ffffffffffffffb8;
  bool local_1;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffffb8);
  if (((in_RDI[4].offsetFromPeak_samples & 1) == 0) || ((in_SIL & 1) != 0)) {
    *(undefined1 *)&in_RDI[4].offsetFromPeak_samples = 1;
    *(undefined4 *)((long)&in_RDI[4].wEnglish + 1) = *(undefined4 *)((long)&in_RDI->playbackId + 1);
    *(undefined1 *)((long)&in_RDI[4].nHypothesesToKeep + 1) =
         *(undefined1 *)((long)&in_RDI->keyPressWidth_samples + 1);
    if (((in_RDI->playbackId & 0x100) != 0) || ((in_RDI->playbackId & 0x10000) != 0)) {
      stParameters::operator=(in_RDI,in_stack_ffffffffffffffb8);
      stKeyPressCollection<short>::operator=
                ((stKeyPressCollection<short> *)in_RDI,
                 (stKeyPressCollection<short> *)in_stack_ffffffffffffffb8);
    }
    if ((in_RDI->playbackId & 0x1000000) != 0) {
      *(byte *)((long)&in_RDI[4].nHypothesesToKeep + 3) =
           *(byte *)((long)&in_RDI->keyPressWidth_samples + 3) & 1;
    }
    if ((in_RDI->keyPressWidth_samples & 1) != 0) {
      stParameters::operator=(in_RDI,in_stack_ffffffffffffffb8);
    }
    if ((in_RDI->keyPressWidth_samples & 0x100) != 0) {
      stKeyPressCollection<short>::operator=
                ((stKeyPressCollection<short> *)in_RDI,
                 (stKeyPressCollection<short> *)in_stack_ffffffffffffffb8);
    }
    stStateUI::Flags::clear((Flags *)0x18b010);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x18b029);
  return local_1;
}

Assistant:

bool TripleBuffer<stStateUI>::update(bool force) {
    std::lock_guard<std::mutex> lock(mutex);
    if (hasChanged && force == false) return false;

    hasChanged = true;

    buffer.flags = this->flags;

    if (this->flags.recalculateSimilarityMap || this->flags.resetOptimization) {
        buffer.params = this->params;
        buffer.keyPresses = this->keyPresses;
    }

    if (this->flags.changeProcessing) {
        buffer.processing = this->processing;
    }

    if (this->flags.applyParameters) {
        buffer.params = this->params;
    }

    if (this->flags.applyHints) {
        buffer.keyPresses = this->keyPresses;
    }

    this->flags.clear();

    return true;
}